

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

SPElement __thiscall
data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
dequeueMinN(PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this,
           size_t n)

{
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar1;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar2;
  size_t in_RDX;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *node;
  size_t n_local;
  PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_local;
  SPElement *result;
  
  _checkN((PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)n,in_RDX);
  my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement::SPElement((SPElement *)this);
  if (in_RDX == 1) {
    pLVar1 = LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::begin
                       ((LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
                        (n + 8));
    my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement::operator=
              ((SPElement *)this,&pLVar1->element);
    LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::deleteFromHeader
              ((LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)(n + 8));
  }
  else {
    pLVar1 = LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::getKthNode
                       ((LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
                        (n + 8),in_RDX - 1);
    pLVar2 = ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::next(pLVar1);
    my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement::operator=
              ((SPElement *)this,&pLVar2->element);
    LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::deleteAfterNode
              ((LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)(n + 8),
               pLVar1);
  }
  return (SPElement)this;
}

Assistant:

inline
    T PriorityQueue<T>::dequeueMinN(const size_t n) {
        _checkN(n);
        T result;
        if (n == 1) {
            result = _list.begin()->element;
            _list.deleteFromHeader();
        }
        else {
            auto node = _list.getKthNode(n - 1);
            result = node->next()->element;
            _list.deleteAfterNode(node);
        }
        return result;
    }